

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja_test.cc
# Opt level: O1

bool anon_unknown.dwarf_18c278::PatternMatchesString(char *pattern,char *str)

{
  char cVar1;
  bool bVar2;
  
  do {
    for (; cVar1 = *pattern, cVar1 == '*'; pattern = pattern + 1) {
      if ((*str != '\0') && (bVar2 = PatternMatchesString(pattern,str + 1), bVar2)) {
        return true;
      }
    }
    if ((cVar1 == '-') || (cVar1 == '\0')) {
      return *str == '\0';
    }
    if (cVar1 != *str) {
      return false;
    }
    pattern = pattern + 1;
    str = str + 1;
  } while( true );
}

Assistant:

bool PatternMatchesString(const char* pattern, const char* str) {
  switch (*pattern) {
    case '\0':
    case '-': return *str == '\0';
    case '*': return (*str != '\0' && PatternMatchesString(pattern, str + 1)) ||
                     PatternMatchesString(pattern + 1, str);
    default:  return *pattern == *str &&
                     PatternMatchesString(pattern + 1, str + 1);
  }
}